

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_writers.h
# Opt level: O2

void date::number_writer<3>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
               (ostreambuf_iterator<char,_std::char_traits<char>_> *dst,int value)

{
  int iVar1;
  
  if (value != 0) {
    number_writer<2>::write<std::ostreambuf_iterator<char,std::char_traits<char>>,int>
              (dst,value / 10);
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,"0123456789"[value % 10])
    ;
    return;
  }
  iVar1 = 3;
  do {
    std::ostreambuf_iterator<char,_std::char_traits<char>_>::operator=(dst,'0');
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

static void write(Iterator& dst, Number value)
    {
        using char_type = typename iterator_traits<Iterator>::value_type;
        constexpr auto digits = number_writer<0>::digits<char_type>();
        if (value == 0)
        {
            for (int i = 0; i < Width - 1; ++i)
                *(dst++) = digits[0];
            *(dst++) = digits[0];
            return;
        }
        number_writer<Width - 1>::write(dst, value / 10);
        *(dst++) = digits[value % 10];
    }